

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_connecter.hpp
# Opt level: O0

void __thiscall zmq::ipc_connecter_t::~ipc_connecter_t(ipc_connecter_t *this)

{
  ipc_connecter_t *in_stack_00000010;
  
  ~ipc_connecter_t(in_stack_00000010);
  return;
}

Assistant:

class ipc_connecter_t ZMQ_FINAL : public stream_connecter_base_t
{
  public:
    //  If 'delayed_start' is true connecter first waits for a while,
    //  then starts connection process.
    ipc_connecter_t (zmq::io_thread_t *io_thread_,
                     zmq::session_base_t *session_,
                     const options_t &options_,
                     address_t *addr_,
                     bool delayed_start_);

  private:
    //  Handlers for I/O events.
    void out_event ();

    //  Internal function to start the actual connection establishment.
    void start_connecting ();

    //  Open IPC connecting socket. Returns -1 in case of error,
    //  0 if connect was successful immediately. Returns -1 with
    //  EAGAIN errno if async connect was launched.
    int open ();

    //  Get the file descriptor of newly created connection. Returns
    //  retired_fd if the connection was unsuccessful.
    fd_t connect ();

    ZMQ_NON_COPYABLE_NOR_MOVABLE (ipc_connecter_t)
}